

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  int iVar1;
  REF_STATUS RVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uVar7;
  int cell;
  char *pcVar8;
  int iVar9;
  long lVar10;
  REF_DBL cell_vol;
  REF_DBL *xyzs [4];
  REF_DBL flux_grad [3];
  REF_DBL tet_flux [4];
  REF_INT nodes [27];
  double local_110;
  REF_DBL *local_108 [4];
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  iVar1 = 0;
  if (0 < nequ) {
    iVar1 = nequ;
  }
  ref_cell = ref_grid->cell[8];
  cell = 0;
  do {
    if (ref_cell->max <= cell) {
      uVar3 = ref_node_ghost_dbl(ref_node,res,nequ);
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        pcVar8 = "ghost res";
        uVar7 = 0x211;
LAB_001b6b0a:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               uVar7,"ref_phys_cc_fv_res",(ulong)uVar3,pcVar8);
      }
      return uVar3;
    }
    RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
    if (RVar2 == 0) {
      uVar4 = (ulong)(uint)ref_cell->node_per;
      if (ref_cell->node_per < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        local_108[uVar5] = ref_node->real + (long)local_a8[uVar5] * 0xf;
      }
      uVar3 = ref_node_xyz_vol(local_108,&local_110);
      if (uVar3 != 0) {
        pcVar8 = "vol";
        uVar7 = 0x201;
        goto LAB_001b6b0a;
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (iVar9 = 0; iVar9 != iVar1; iVar9 = iVar9 + 1) {
          uVar4 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
            local_c8[uVar5] = flux[(local_a8[uVar5] * 3 + (int)lVar10) * nequ + iVar9];
          }
          uVar3 = ref_node_xyz_grad(local_108,local_c8,local_e8);
          if (uVar3 != 0) {
            pcVar8 = "grad";
            uVar7 = 0x208;
            goto LAB_001b6b0a;
          }
          uVar4 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
            iVar6 = local_a8[uVar5] * nequ + iVar9;
            res[iVar6] = local_e8[lVar10] * 0.25 * local_110 + res[iVar6];
          }
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid, REF_INT nequ,
                                      REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT equ, dir, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      xyzs[cell_node] = ref_node_xyz_ptr(ref_node, nodes[cell_node]);
    }
    RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
    for (dir = 0; dir < 3; dir++) {
      for (equ = 0; equ < nequ; equ++) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          tet_flux[cell_node] =
              flux[equ + dir * nequ + 3 * nequ * nodes[cell_node]];
        }
        RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          res[equ + nequ * nodes[cell_node]] +=
              0.25 * flux_grad[dir] * cell_vol;
        }
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}